

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

pointer poly::
        delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>,std::integral_constant<bool,true>>
        ::clone_func<Impl2T<poly::virtual_cloning_policy>>
                  (Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
                   *a,pointer obj,void_pointer dest,Operation op)

{
  Impl2T<poly::virtual_cloning_policy> *pIVar1;
  Allocator<Impl2T<poly::virtual_cloning_policy>,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>
  local_25;
  Operation local_24;
  allocator_type alloc;
  Impl2T<poly::virtual_cloning_policy> *pIStack_20;
  Operation op_local;
  void_pointer dest_local;
  pointer obj_local;
  Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
  *a_local;
  
  local_24 = op;
  pIStack_20 = (Impl2T<poly::virtual_cloning_policy> *)dest;
  custom::
  Allocator<Impl2T<poly::virtual_cloning_policy>,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>
  ::Allocator<Interface,void>(&local_25,a);
  if (local_24 == Clone) {
    std::
    allocator_traits<custom::Allocator<Impl2T<poly::virtual_cloning_policy>,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>>
    ::construct<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>const&>
              ((Allocator<Impl2T<poly::virtual_cloning_policy>,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
                *)&local_25,pIStack_20,(Impl2T<poly::virtual_cloning_policy> *)obj);
  }
  else {
    std::
    allocator_traits<custom::Allocator<Impl2T<poly::virtual_cloning_policy>,custom::AllocatorDescriptor<std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>>>>
    ::construct<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
              ((Allocator<Impl2T<poly::virtual_cloning_policy>,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
                *)&local_25,pIStack_20,(Impl2T<poly::virtual_cloning_policy> *)obj);
  }
  pIVar1 = pIStack_20;
  custom::
  Allocator<Impl2T<poly::virtual_cloning_policy>,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
  ::~Allocator((Allocator<Impl2T<poly::virtual_cloning_policy>,_custom::AllocatorDescriptor<std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>_>_>
                *)&local_25);
  return &pIVar1->super_Interface;
}

Assistant:

static pointer clone_func(const Allocator& a, pointer obj, void_pointer dest, Operation op)
    {
        using traits      = typename std::allocator_traits<Allocator>::template rebind_traits<T>;
        using obj_pointer = typename traits::pointer;
        using obj_const_pointer = typename traits::const_pointer;

        typename traits::allocator_type alloc(a);
        if (op == Clone) {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), *static_cast<obj_const_pointer>(obj));
        } else {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), std::move(*static_cast<obj_pointer>(obj)));
        }
        return static_cast<obj_pointer>(dest);
    }